

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCo.c
# Opt level: O2

Vec_Int_t * Gia_PolynAddHaRoots(Gia_Man_t *pGia)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Vec_Int_t *vXorPairs;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  long lVar6;
  int iVar7;
  
  p = Vec_IntAlloc(100);
  vXorPairs = Vec_IntAlloc(100);
  pGVar4 = Gia_ManCo(pGia,pGia->vCos->nSize + -1);
  Gia_PolynCoreNonXors_rec
            (pGia,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff),vXorPairs);
  Gia_ManSetPhase(pGia);
  for (iVar7 = 1; iVar7 < vXorPairs->nSize; iVar7 = iVar7 + 2) {
    iVar2 = Vec_IntEntry(vXorPairs,iVar7 + -1);
    iVar3 = Vec_IntEntry(vXorPairs,iVar7);
    pGVar4 = Gia_ManObj(pGia,iVar2);
    pGVar5 = Gia_ManObj(pGia,iVar3);
    iVar2 = Abc_Var2Lit(iVar2,(uint)((ulong)*(undefined8 *)pGVar4 >> 0x3f));
    iVar3 = Abc_Var2Lit(iVar3,(uint)((ulong)*(undefined8 *)pGVar5 >> 0x3f));
    iVar2 = Gia_ManAppendAnd(pGia,iVar2,iVar3);
    iVar2 = Abc_Lit2Var(iVar2);
    Vec_IntPush(p,iVar2);
  }
  Vec_IntFree(vXorPairs);
  iVar7 = p->nSize;
  iVar2 = iVar7 / 2;
  for (lVar6 = 0; iVar7 = iVar7 + -1, lVar6 < iVar2; lVar6 = lVar6 + 1) {
    piVar1 = p->pArray;
    iVar3 = piVar1[lVar6];
    piVar1[lVar6] = piVar1[iVar7];
    piVar1[iVar7] = iVar3;
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_PolynAddHaRoots( Gia_Man_t * pGia )
{
    int i, iFan0, iFan1;
    Vec_Int_t * vNewOuts = Vec_IntAlloc( 100 );
    Vec_Int_t * vXorPairs = Vec_IntAlloc( 100 );
    Gia_Obj_t * pObj = Gia_ManCo( pGia, Gia_ManCoNum(pGia)-1 );
    Gia_PolynCoreNonXors_rec( pGia, Gia_ObjFanin0(pObj), vXorPairs );
    // add new outputs
    Gia_ManSetPhase( pGia );
    Vec_IntForEachEntryDouble( vXorPairs, iFan0, iFan1, i )
    {
        Gia_Obj_t * pFan0 = Gia_ManObj( pGia, iFan0 );
        Gia_Obj_t * pFan1 = Gia_ManObj( pGia, iFan1 );
        int iLit0 = Abc_Var2Lit( iFan0, pFan0->fPhase );
        int iLit1 = Abc_Var2Lit( iFan1, pFan1->fPhase );
        int iRoot = Gia_ManAppendAnd( pGia, iLit0, iLit1 );
        Vec_IntPush( vNewOuts, Abc_Lit2Var(iRoot) );
    }
    Vec_IntFree( vXorPairs );
    Vec_IntReverseOrder( vNewOuts );
//    Vec_IntPop( vNewOuts );
    return vNewOuts;
}